

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanImplX11.cpp
# Opt level: O2

bool sf::priv::VulkanImplX11::isAvailable(bool requireGraphics)

{
  byte bVar1;
  pointer pVVar2;
  int iVar3;
  undefined1 *puVar4;
  byte bVar5;
  undefined7 in_register_00000039;
  pointer __s1;
  uint32_t extensionCount;
  undefined4 local_4c;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensionProperties;
  
  if (isAvailable(bool)::checked != '\0') goto LAB_001c80c6;
  isAvailable(bool)::checked = '\x01';
  if ((anonymous_namespace)::wrapper == 0) {
    (anonymous_namespace)::wrapper = dlopen("libvulkan.so.1",1);
    if ((anonymous_namespace)::wrapper != 0) {
      DAT_0027ab00 = dlsym((anonymous_namespace)::wrapper,"vkGetInstanceProcAddr");
      if (((DAT_0027ab00 != 0) &&
          (_DAT_0027ab08 =
                dlsym((anonymous_namespace)::wrapper,"vkEnumerateInstanceLayerProperties"),
          _DAT_0027ab08 != 0)) &&
         (DAT_0027ab10 = (code *)dlsym((anonymous_namespace)::wrapper,
                                       "vkEnumerateInstanceExtensionProperties"),
         DAT_0027ab10 != (code *)0x0)) goto LAB_001c7f6b;
      dlclose((anonymous_namespace)::wrapper);
      (anonymous_namespace)::wrapper = 0;
    }
    isAvailable(bool)::computeAvailable = 0;
    isAvailable(bool)::graphicsAvailable = 0;
  }
  else {
LAB_001c7f6b:
    local_4c = (undefined4)CONCAT71(in_register_00000039,requireGraphics);
    isAvailable(bool)::computeAvailable = 1;
    isAvailable(bool)::graphicsAvailable = 1;
    extensionProperties.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    extensionProperties.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    extensionProperties.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extensionCount = 0;
    (*DAT_0027ab10)(0,&extensionCount,0);
    std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
              (&extensionProperties,(ulong)extensionCount);
    (*DAT_0027ab10)(0,&extensionCount,
                    extensionProperties.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    pVVar2 = extensionProperties.
             super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar1 = 0;
    bVar5 = 0;
    for (__s1 = extensionProperties.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                _M_impl.super__Vector_impl_data._M_start; __s1 != pVVar2; __s1 = __s1 + 1) {
      iVar3 = strcmp(__s1->extensionName,"VK_KHR_surface");
      if (iVar3 == 0) {
        bVar1 = 1;
      }
      else {
        iVar3 = strcmp(__s1->extensionName,"VK_KHR_xlib_surface");
        bVar5 = bVar5 | iVar3 == 0;
      }
    }
    if (!(bool)(bVar1 & bVar5)) {
      isAvailable(bool)::graphicsAvailable = 0;
    }
    std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~_Vector_base
              (&extensionProperties.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>);
    requireGraphics = SUB41(local_4c,0);
  }
LAB_001c80c6:
  puVar4 = &isAvailable(bool)::computeAvailable;
  if (requireGraphics != false) {
    puVar4 = &isAvailable(bool)::graphicsAvailable;
  }
  return (bool)*puVar4;
}

Assistant:

bool VulkanImplX11::isAvailable(bool requireGraphics)
{
    static bool checked = false;
    static bool computeAvailable = false;
    static bool graphicsAvailable = false;

    if (!checked)
    {
        checked = true;

        // Check if the library is available
        computeAvailable = wrapper.loadLibrary();

        // To check for instance extensions we don't need to differentiate between graphics and compute
        graphicsAvailable = computeAvailable;

        if (graphicsAvailable)
        {
            // Retrieve the available instance extensions
            std::vector<VkExtensionProperties> extensionProperties;

            uint32_t extensionCount = 0;

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, NULL);

            extensionProperties.resize(extensionCount);

            wrapper.vkEnumerateInstanceExtensionProperties(0, &extensionCount, &extensionProperties[0]);

            // Check if the necessary extensions are available
            bool has_VK_KHR_surface = false;
            bool has_VK_KHR_platform_surface = false;

            for (std::vector<VkExtensionProperties>::const_iterator iter = extensionProperties.begin(); iter != extensionProperties.end(); ++iter)
            {
                if (!std::strcmp(iter->extensionName, VK_KHR_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_surface = true;
                }
                else if (!std::strcmp(iter->extensionName, VK_KHR_XLIB_SURFACE_EXTENSION_NAME))
                {
                    has_VK_KHR_platform_surface = true;
                }
            }

            if (!has_VK_KHR_surface || !has_VK_KHR_platform_surface)
                graphicsAvailable = false;
        }
    }

    if (requireGraphics)
        return graphicsAvailable;

    return computeAvailable;
}